

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles3::Functional::eval_selection_bvec3(ShaderEvalContext *c)

{
  float fVar1;
  float *pfVar2;
  VecAccess<float,_4,_3> local_70;
  Vector<float,_3> local_58;
  undefined1 local_4c [13];
  Vector<bool,_3> local_3f;
  Vector<float,_3> local_3c;
  undefined1 local_30 [14];
  Vector<bool,_3> local_22;
  Functional local_1f [3];
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  pfVar2 = tcu::Vector<float,_4>::z(c->in);
  fVar1 = *pfVar2;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_30,(int)local_10 + 0x40,1,2);
  tcu::Vector<float,_3>::Vector(&local_3c,0.0,0.0,0.0);
  tcu::greaterThan<float,3>((tcu *)&local_22,(Vector<float,_3> *)local_30,&local_3c);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_4c,(int)local_10 + 0x50,3,1);
  tcu::Vector<float,_3>::Vector(&local_58,0.0,0.0,0.0);
  tcu::greaterThan<float,3>((tcu *)&local_3f,(Vector<float,_3> *)local_4c,&local_58);
  selection<tcu::Vector<bool,3>>(local_1f,0.0 < fVar1,&local_22,&local_3f);
  tcu::Vector<bool,_3>::asFloat((Vector<bool,_3> *)&local_1c);
  tcu::Vector<float,_4>::xyz(&local_70,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_70,&local_1c);
  return;
}

Assistant:

void eval_selection_bvec3	(ShaderEvalContext& c) { c.color.xyz()	= selection(c.in[0].z() > 0.0f,			greaterThan(c.in[1].swizzle(1, 2, 0), Vec3(0.0f, 0.0f, 0.0f)),			greaterThan(c.in[2].swizzle(3, 1, 2), Vec3(0.0f, 0.0f, 0.0f))).asFloat(); }